

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  double t;
  uint64_t uVar1;
  bool bVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  char (*ts_3) [2];
  char print_buffer [64];
  spirv_cross local_310 [32];
  string local_2f0;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t local_208;
  size_t local_200;
  uint local_1f8 [8];
  TypeID local_1d8;
  undefined8 local_1c0;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  undefined1 local_180 [192];
  char (*local_c0) [2];
  size_t local_b8;
  size_t local_b0;
  char acStack_a8 [32];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  t = (c->m).c[col].r[row].f64;
  if ((NAN(t) || NAN(t)) || ABS(t) == INFINITY) {
    bVar2 = is_legacy(this);
    if (bVar2) {
      if ((this->options).es == true) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_2d0,"FP64 not supported in ES profile.",(allocator *)local_180);
        CompilerError::CompilerError(pCVar3,(string *)local_2d0);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).version < 400) {
        ::std::__cxx11::string::string
                  ((string *)local_2d0,"GL_ARB_gpu_shader_fp64",(allocator *)local_180);
        require_extension_internal(this,(string *)local_2d0);
        ::std::__cxx11::string::~string((string *)local_2d0);
      }
      if (((t < INFINITY) && (-INFINITY < t)) && (!NAN(t))) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_2d0,"Cannot represent non-finite floating point constant.",
                   (allocator *)local_180);
        CompilerError::CompilerError(pCVar3,(string *)local_2d0);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      local_2d0._32_8_ = local_2d0 + 0x38;
      local_2d0._8_4_ = 0;
      local_2d0._0_8_ = &PTR__SPIRType_003a6498;
      local_2d0._20_4_ = 1;
      local_2d0._40_8_ = 0;
      local_2d0._48_8_ = 8;
      local_2d0._88_8_ = local_2d0 + 0x70;
      local_2d0._96_8_ = 0;
      local_2d0._104_8_ = 8;
      local_2d0._120_4_ = 0;
      local_2d0[0x7c] = false;
      local_2d0[0x7d] = false;
      local_2d0._128_4_ = StorageClassGeneric;
      local_2d0._136_8_ = local_2d0 + 0xa0;
      local_2d0._144_8_ = 0;
      local_2d0._152_8_ = 8;
      local_210 = local_1f8;
      local_208 = 0;
      local_200 = 8;
      local_1d8.id = 0;
      local_1c0._0_4_ = 0;
      local_1c0._4_4_ = 0;
      local_1b8 = &p_Stack_188;
      local_1b0 = 1;
      local_180._32_8_ = local_180 + 0x38;
      local_180._8_4_ = 0;
      local_180._0_8_ = &PTR__SPIRType_003a6498;
      local_180._40_8_ = 0;
      local_1a8._M_nxt = (_Hash_node_base *)0x0;
      sStack_1a0 = 0;
      local_180._48_8_ = 8;
      local_180._88_8_ = local_180 + 0x70;
      local_180._96_8_ = 0;
      local_180._104_8_ = 8;
      local_180._120_4_ = 0;
      local_180[0x7c] = false;
      local_180[0x7d] = false;
      local_180._144_8_ = 0;
      local_180._136_8_ = local_180 + 0xa0;
      local_180._152_8_ = 8;
      ts_3 = (char (*) [2])acStack_a8;
      local_b8 = 0;
      local_b0 = 8;
      local_88.id = 0;
      local_70._0_4_ = 0;
      local_70._4_4_ = 0;
      local_198 = 1.0;
      local_190 = 0;
      p_Stack_188 = (__node_base_ptr)0x0;
      local_68 = &p_Stack_38;
      local_60 = 1;
      local_58._M_nxt = (_Hash_node_base *)0x0;
      sStack_50 = 0;
      local_48 = 1.0;
      local_40 = 0;
      p_Stack_38 = (__node_base_ptr)0x0;
      local_2d0._12_8_ = 0x400000000e;
      local_180._12_4_ = 10;
      local_180._16_4_ = 0x40;
      local_180._20_4_ = 1;
      local_2d0._24_4_ = local_2d0._20_4_;
      local_180._24_4_ = local_2d0._20_4_;
      local_180._128_4_ = local_2d0._128_4_;
      local_c0 = ts_3;
      if ((this->options).es == true) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)print_buffer,"64-bit integers/float not supported in ES profile.",
                   (allocator *)&local_2f0);
        CompilerError::CompilerError(pCVar3,(string *)print_buffer);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar1 = (c->m).c[col].r[row].u64;
      ::std::__cxx11::string::string
                ((string *)print_buffer,"GL_ARB_gpu_shader_int64",(allocator *)&local_2f0);
      require_extension_internal(this,(string *)print_buffer);
      ::std::__cxx11::string::~string((string *)print_buffer);
      pcVar4 = "ul";
      if ((this->backend).long_long_literal_suffix != false) {
        pcVar4 = "ull";
      }
      sprintf(print_buffer,"0x%llx%s",uVar1,pcVar4);
      (*(this->super_Compiler)._vptr_Compiler[0x34])(local_310,this,local_2d0,local_180);
      join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[2]>
                (&local_2f0,local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                 (char (*) [2])print_buffer,(char (*) [64])0x30ae46,ts_3);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      ::std::__cxx11::string::~string((string *)&local_2f0);
      ::std::__cxx11::string::~string((string *)local_310);
      SPIRType::~SPIRType((SPIRType *)local_180);
      SPIRType::~SPIRType((SPIRType *)local_2d0);
    }
  }
  else {
    convert_to_string_abi_cxx11_
              ((string *)local_2d0,
               (spirv_cross *)(ulong)(uint)(int)this->current_locale_radix_character,t,'\0');
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_2d0);
    ::std::__cxx11::string::~string((string *)local_2d0);
    if ((this->backend).double_literal_suffix == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es)
				SPIRV_CROSS_THROW("64-bit integers/float not supported in ES profile.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, ")");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(double_value, current_locale_radix_character);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}